

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O0

string * normalize(string *__return_storage_ptr__,string *workingDirectory,string *path0)

{
  bool bVar1;
  undefined8 uVar2;
  SmallVectorImpl<char> *tmp;
  size_t sVar3;
  long lVar4;
  long lVar5;
  StringRef workingDirectory_00;
  StringRef local_188;
  undefined4 local_178;
  allocator local_171;
  Manifest *local_170;
  StringRef local_160;
  undefined1 local_150 [8];
  SmallString<256U> absPathTmp;
  string *path0_local;
  string *workingDirectory_local;
  
  absPathTmp.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       path0;
  uVar2 = std::__cxx11::string::data();
  local_160.Data = (char *)uVar2;
  uVar2 = std::__cxx11::string::length();
  local_160.Length = uVar2;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_150,local_160);
  local_170 = (Manifest *)std::__cxx11::string::data();
  tmp = (SmallVectorImpl<char> *)std::__cxx11::string::length();
  workingDirectory_00.Length = (size_t)local_150;
  workingDirectory_00.Data = (char *)tmp;
  bVar1 = llbuild::ninja::Manifest::normalize_path(local_170,workingDirectory_00,tmp);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    sVar3 = llvm::SmallVectorBase::size((SmallVectorBase *)local_150);
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 + lVar5 + 2U <= sVar3) {
      __assert_fail("absPathTmp.size() < workingDirectory.size() + 1 + path0.size() + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
                    ,0x1c,"std::string normalize(std::string, std::string)");
    }
    local_188 = llvm::SmallString<256U>::str((SmallString<256U> *)local_150);
    llvm::StringRef::operator_cast_to_string(__return_storage_ptr__,&local_188);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"<failed to normalize>",&local_171);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  local_178 = 1;
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_150);
  return __return_storage_ptr__;
}

Assistant:

static std::string normalize(std::string workingDirectory, std::string path0) {
  SmallString<256> absPathTmp = StringRef(path0);
  if (!Manifest::normalize_path(workingDirectory, absPathTmp)) {
    return "<failed to normalize>";
  }
  assert(absPathTmp.size() < workingDirectory.size() + 1 + path0.size() + 1);
  return absPathTmp.str();
}